

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlBufDumpEnumeration(xmlOutputBufferPtr buf,xmlEnumerationPtr cur)

{
  xmlEnumerationPtr pxVar1;
  
  while (pxVar1 = cur, pxVar1 != (xmlEnumerationPtr)0x0) {
    xmlOutputBufferWriteString(buf,(char *)pxVar1->name);
    cur = (xmlEnumerationPtr)0x0;
    if (pxVar1->next != (_xmlEnumeration *)0x0) {
      xmlOutputBufferWrite(buf,3," | ");
      cur = pxVar1->next;
    }
  }
  xmlOutputBufferWrite(buf,1,")");
  return;
}

Assistant:

static void
xmlBufDumpEnumeration(xmlOutputBufferPtr buf, xmlEnumerationPtr cur) {
    while (cur != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) cur->name);
        if (cur->next != NULL)
            xmlOutputBufferWrite(buf, 3, " | ");

        cur = cur->next;
    }

    xmlOutputBufferWrite(buf, 1, ")");
}